

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libevent-server.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  SSL_METHOD *meth;
  SSL_CTX *ctx;
  long lVar2;
  ulong uVar3;
  char *file;
  SSL_CTX *unaff_RBX;
  char *pcVar4;
  addrinfo *paVar5;
  char *unaff_R15;
  sigaction act;
  addrinfo *local_110;
  SSL_CTX *local_108;
  char *pcStack_100;
  addrinfo local_f8;
  _union_1457 local_c0 [19];
  
  if (argc < 4) {
    main_cold_1();
LAB_001028a7:
    ctx = unaff_RBX;
    uVar3 = ERR_get_error();
    file = ERR_error_string(uVar3,(char *)0x0);
    pcVar4 = "Could not create SSL/TLS context: %s";
LAB_001028ff:
    errx(1,pcVar4,file);
  }
  else {
    memset(local_c0,0,0x98);
    local_c0[0] = (_union_1457)0x1;
    sigaction(0xd,(sigaction *)local_c0,(sigaction *)0x0);
    pcVar4 = argv[1];
    file = argv[2];
    unaff_R15 = argv[3];
    meth = (SSL_METHOD *)TLS_server_method();
    ctx = SSL_CTX_new(meth);
    unaff_RBX = (SSL_CTX *)argv;
    if (ctx == (SSL_CTX *)0x0) goto LAB_001028a7;
    SSL_CTX_set_options(ctx,0x82030850);
    lVar2 = SSL_CTX_ctrl(ctx,0x5c,0,"P-256");
    if (lVar2 != 1) {
      uVar3 = ERR_get_error();
      file = ERR_error_string(uVar3,(char *)0x0);
      pcVar4 = "SSL_CTX_set1_curves_list failed: %s";
      goto LAB_001028ff;
    }
    iVar1 = SSL_CTX_use_PrivateKey_file(ctx,file,1);
    if (iVar1 != 1) {
      pcVar4 = "Could not read private key file %s";
      goto LAB_001028ff;
    }
    iVar1 = SSL_CTX_use_certificate_chain_file(ctx,unaff_R15);
    if (iVar1 != 1) {
      pcVar4 = "Could not read certificate file %s";
      file = unaff_R15;
      goto LAB_001028ff;
    }
    SSL_CTX_set_alpn_select_cb(ctx,alpn_select_proto_cb,0);
    unaff_R15 = (char *)event_base_new();
    local_f8.ai_addrlen = 0;
    local_f8._20_4_ = 0;
    local_f8.ai_addr = (sockaddr *)0x0;
    local_f8.ai_canonname = (char *)0x0;
    local_f8.ai_next = (addrinfo *)0x0;
    local_f8.ai_socktype = 1;
    local_f8.ai_protocol = 0;
    local_f8.ai_flags = 0x21;
    local_f8.ai_family = 0;
    local_108 = ctx;
    pcStack_100 = unaff_R15;
    iVar1 = getaddrinfo((char *)0x0,pcVar4,&local_f8,&local_110);
    if (iVar1 == 0) {
      if (local_110 != (addrinfo *)0x0) {
        paVar5 = local_110;
        do {
          lVar2 = evconnlistener_new_bind
                            (unaff_R15,acceptcb,&local_108,10,0x10,paVar5->ai_addr,
                             paVar5->ai_addrlen);
          if (lVar2 != 0) goto LAB_0010286b;
          paVar5 = paVar5->ai_next;
        } while (paVar5 != (addrinfo *)0x0);
      }
      pcVar4 = "Could not start listener";
      goto LAB_0010285f;
    }
  }
  pcVar4 = "Could not resolve server address";
LAB_0010285f:
  errx(1,pcVar4);
LAB_0010286b:
  freeaddrinfo(local_110);
  event_base_loop(unaff_R15,0);
  event_base_free(unaff_R15);
  SSL_CTX_free(ctx);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
  struct sigaction act;

  if (argc < 4) {
    fprintf(stderr, "Usage: libevent-server PORT KEY_FILE CERT_FILE\n");
    exit(EXIT_FAILURE);
  }

  memset(&act, 0, sizeof(struct sigaction));
  act.sa_handler = SIG_IGN;
  sigaction(SIGPIPE, &act, NULL);

  run(argv[1], argv[2], argv[3]);
  return 0;
}